

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

void __thiscall
Lib::DHMap<Kernel::Term_*,_unsigned_int,_Inferences::SharedTermHash,_Lib::DefaultHash2>::expand
          (DHMap<Kernel::Term_*,_unsigned_int,_Inferences::SharedTermHash,_Lib::DefaultHash2> *this)

{
  uint uVar1;
  int iVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Entry *p;
  Entry *pEVar8;
  Exception *this_00;
  Entry *pEVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  void **head;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  if (0x1c < (long)this->_capacityIndex) {
    this_00 = (Exception *)__cxa_allocate_exception(0x28);
    Exception::Exception(this_00,"Lib::DHMap::expand: MaxCapacityIndex reached.");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  iVar14 = *(int *)(DHMapTableCapacities + (long)this->_capacityIndex * 4 + 4);
  lVar11 = (long)iVar14;
  uVar10 = lVar11 * 0x18 + 0xfU & 0xfffffffffffffff0;
  if (uVar10 == 0) {
    pEVar8 = (Entry *)FixedSizeAllocator<8UL>::alloc
                                ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar10 < 0x11) {
    pEVar8 = (Entry *)FixedSizeAllocator<16UL>::alloc
                                ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
    ;
  }
  else if (uVar10 < 0x19) {
    pEVar8 = (Entry *)FixedSizeAllocator<24UL>::alloc
                                ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30))
    ;
  }
  else if (uVar10 < 0x21) {
    pEVar8 = (Entry *)FixedSizeAllocator<32UL>::alloc
                                ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48))
    ;
  }
  else if (uVar10 < 0x31) {
    pEVar8 = (Entry *)FixedSizeAllocator<48UL>::alloc
                                ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60))
    ;
  }
  else if (uVar10 < 0x41) {
    pEVar8 = (Entry *)FixedSizeAllocator<64UL>::alloc
                                ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78))
    ;
  }
  else {
    pEVar8 = (Entry *)::operator_new(uVar10,0x10);
  }
  pEVar3 = this->_entries;
  pEVar4 = this->_afterLast;
  uVar1 = this->_timestamp;
  iVar2 = this->_capacity;
  this->_timestamp = 1;
  this->_size = 0;
  this->_deleted = 0;
  iVar17 = this->_capacityIndex;
  this->_capacityIndex = iVar17 + 1;
  this->_capacity = iVar14;
  this->_nextExpansionOccupancy = *(int *)(DHMapTableNextExpansions + (long)iVar17 * 4 + 4);
  auVar7 = _DAT_00871040;
  auVar6 = _DAT_00871030;
  auVar5 = _DAT_00871020;
  if (iVar14 != 0) {
    lVar12 = lVar11 + -1;
    auVar13._8_4_ = (int)lVar12;
    auVar13._0_8_ = lVar12;
    auVar13._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar10 = 0;
    auVar13 = auVar13 ^ _DAT_00871040;
    pEVar9 = pEVar8;
    do {
      auVar15._8_4_ = (int)uVar10;
      auVar15._0_8_ = uVar10;
      auVar15._12_4_ = (int)(uVar10 >> 0x20);
      auVar16 = (auVar15 | auVar6) ^ auVar7;
      iVar14 = auVar13._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                  iVar14 < auVar16._4_4_) & 1)) {
        (pEVar9->field_0)._infoData = 0;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        pEVar9[1].field_0._infoData = 0;
      }
      auVar15 = (auVar15 | auVar5) ^ auVar7;
      iVar17 = auVar15._4_4_;
      if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar15._0_4_ <= auVar13._0_4_)) {
        pEVar9[2].field_0._infoData = 0;
        pEVar9[3].field_0._infoData = 0;
      }
      uVar10 = uVar10 + 4;
      pEVar9 = pEVar9 + 4;
    } while ((lVar11 + 3U & 0xfffffffffffffffc) != uVar10);
  }
  this->_entries = pEVar8;
  this->_afterLast = pEVar8 + this->_capacity;
  for (pEVar8 = pEVar3; pEVar8 != pEVar4; pEVar8 = pEVar8 + 1) {
    if (((pEVar8->field_0)._infoData & 1U) == 0 && (uint)(pEVar8->field_0)._infoData >> 2 == uVar1)
    {
      insert(this,pEVar8->_key,pEVar8->_val);
    }
  }
  if ((iVar2 != 0) && (pEVar3 != (Entry *)0x0)) {
    uVar10 = (long)iVar2 * 0x18 + 0xfU & 0xfffffffffffffff0;
    if (uVar10 == 0) {
      *(undefined8 *)pEVar3 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pEVar3;
    }
    else if (uVar10 < 0x11) {
      *(undefined8 *)pEVar3 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pEVar3;
    }
    else if (uVar10 < 0x19) {
      *(undefined8 *)pEVar3 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pEVar3;
    }
    else if (uVar10 < 0x21) {
      *(undefined8 *)pEVar3 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pEVar3;
    }
    else if (uVar10 < 0x31) {
      *(undefined8 *)pEVar3 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pEVar3;
    }
    else {
      if (0x40 < uVar10) {
        operator_delete(pEVar3,0x10);
        return;
      }
      *(undefined8 *)pEVar3 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pEVar3;
    }
  }
  return;
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }